

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracer.cpp
# Opt level: O0

RGB __thiscall
RayTracer::processPixelOnSphere
          (RayTracer *this,Point *rayBeg,Point *pointOnSphere,const_iterator sphereIt,
          int recursionLevel)

{
  Point a;
  bool bVar1;
  RGB RVar2;
  const_iterator cVar3;
  __normal_iterator<const_Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_> begin;
  const_iterator begin_00;
  const_iterator end;
  pointer pSVar4;
  reference sphere;
  Point PVar5;
  bool local_181;
  RGB local_180;
  RGB local_178;
  undefined1 auStack_168 [5];
  RGB reflectedColor;
  undefined1 local_14c [8];
  Segment refl;
  float fStack_12c;
  float local_128;
  Vector local_100;
  undefined2 local_ee;
  uint8_t local_ec;
  undefined2 local_eb;
  uint8_t local_e9;
  Point local_e8;
  undefined8 local_d8;
  float local_d0;
  Point local_c8;
  undefined8 local_b8;
  float local_b0;
  undefined8 local_a8;
  float local_a0;
  undefined8 local_98;
  float local_90;
  undefined1 local_88 [8];
  Vector normalVec;
  undefined2 local_6b;
  uint8_t local_69;
  RGB resultCol;
  bool isInShadow;
  int recursionLevel_local;
  Point *pointOnSphere_local;
  Point *rayBeg_local;
  RayTracer *this_local;
  const_iterator sphereIt_local;
  
  this_local = (RayTracer *)sphereIt._M_current;
  cVar3 = std::vector<Sphere,_std::allocator<Sphere>_>::cbegin
                    (&(this->super_RayTracerBase).config.spheres);
  bVar1 = pointInShadow<__gnu_cxx::__normal_iterator<Sphere_const*,std::vector<Sphere,std::allocator<Sphere>>>>
                    (pointOnSphere,&(this->super_RayTracerBase).config.super_BaseConfig.light,
                     (__normal_iterator<const_Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_>
                      )cVar3._M_current,
                     (__normal_iterator<const_Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_>
                      )this_local);
  local_181 = true;
  if (!bVar1) {
    begin = __gnu_cxx::
            __normal_iterator<const_Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_>::
            operator+((__normal_iterator<const_Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_>
                       *)&this_local,1);
    cVar3 = std::vector<Sphere,_std::allocator<Sphere>_>::cend
                      (&(this->super_RayTracerBase).config.spheres);
    bVar1 = pointInShadow<__gnu_cxx::__normal_iterator<Sphere_const*,std::vector<Sphere,std::allocator<Sphere>>>>
                      (pointOnSphere,&(this->super_RayTracerBase).config.super_BaseConfig.light,
                       begin,(__normal_iterator<const_Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_>
                              )cVar3._M_current);
    local_181 = true;
    if (!bVar1) {
      begin_00 = std::vector<Plane,_std::allocator<Plane>_>::cbegin
                           (&(this->super_RayTracerBase).config.planes);
      end = std::vector<Plane,_std::allocator<Plane>_>::cend
                      (&(this->super_RayTracerBase).config.planes);
      local_181 = pointInShadow<__gnu_cxx::__normal_iterator<Plane_const*,std::vector<Plane,std::allocator<Plane>>>>
                            (pointOnSphere,
                             &(this->super_RayTracerBase).config.super_BaseConfig.light,
                             (__normal_iterator<const_Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>
                              )begin_00._M_current,
                             (__normal_iterator<const_Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>
                              )end._M_current);
    }
  }
  if (local_181 == false) {
    local_a0 = pointOnSphere->z;
    local_a8._0_4_ = pointOnSphere->x;
    local_a8._4_4_ = pointOnSphere->y;
    pSVar4 = __gnu_cxx::
             __normal_iterator<const_Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_>::
             operator->((__normal_iterator<const_Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_>
                         *)&this_local);
    local_b0 = local_a0;
    local_b8 = local_a8;
    a.z = local_a0;
    a.x = (float)(undefined4)local_a8;
    a.y = (float)local_a8._4_4_;
    PVar5 = operator-(a,&pSVar4->center);
    local_c8.z = PVar5.z;
    local_90 = local_c8.z;
    local_c8._0_8_ = PVar5._0_8_;
    local_98._0_4_ = local_c8.x;
    local_98._4_4_ = local_c8.y;
    local_c8 = PVar5;
    pSVar4 = __gnu_cxx::
             __normal_iterator<const_Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_>::
             operator->((__normal_iterator<const_Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_>
                         *)&this_local);
    local_d0 = local_90;
    local_d8 = local_98;
    PVar5.z = local_90;
    PVar5.x = (float)(undefined4)local_98;
    PVar5.y = (float)local_98._4_4_;
    PVar5 = operator/(PVar5,pSVar4->radius);
    local_e8.z = PVar5.z;
    normalVec.x = local_e8.z;
    local_e8._0_8_ = PVar5._0_8_;
    local_88._0_4_ = local_e8.x;
    local_88._4_4_ = local_e8.y;
    local_e8 = PVar5;
    pSVar4 = __gnu_cxx::
             __normal_iterator<const_Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_>::
             operator->((__normal_iterator<const_Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_>
                         *)&this_local);
    local_ec = (pSVar4->color).b;
    local_ee._0_1_ = (pSVar4->color).r;
    local_ee._1_1_ = (pSVar4->color).g;
    PVar5 = operator-((this->super_RayTracerBase).config.super_BaseConfig.light,pointOnSphere);
    local_128 = PVar5.z;
    local_100.z = local_128;
    stack0xfffffffffffffed0 = PVar5._0_8_;
    local_100.x = refl.b.z;
    local_100.y = fStack_12c;
    refl.b.y._2_1_ = local_ec;
    refl.b.y._0_2_ = local_ee;
    unique0x1000057e = PVar5;
    RVar2 = calculateColorInLight(this,refl.b.y._0_3_,(Vector *)local_88,&local_100);
    local_eb = RVar2._0_2_;
    local_e9 = RVar2.b;
    local_6b = local_eb;
    local_69 = local_e9;
  }
  else {
    pSVar4 = __gnu_cxx::
             __normal_iterator<const_Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_>::
             operator->((__normal_iterator<const_Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_>
                         *)&this_local);
    normalVec.z._0_3_ = pSVar4->color;
    RVar2 = operator*(normalVec.z._0_3_,
                      (this->super_RayTracerBase).config.super_BaseConfig.ambientCoefficient);
    local_6b = RVar2._0_2_;
    local_69 = RVar2.b;
  }
  if (recursionLevel < (this->super_RayTracerBase).config.super_BaseConfig.maxRecursionLevel) {
    pSVar4 = __gnu_cxx::
             __normal_iterator<const_Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_>::
             operator->((__normal_iterator<const_Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_>
                         *)&this_local);
    bVar1 = isCloseToZero<float>(pSVar4->reflectionCoefficient);
    if (!bVar1) {
      auStack_168._0_4_ = rayBeg->x;
      unique0x00012004 = rayBeg->y;
      sphere = __gnu_cxx::
               __normal_iterator<const_Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_>::
               operator*((__normal_iterator<const_Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_>
                          *)&this_local);
      reflection((Segment *)local_14c,(Segment *)auStack_168,sphere);
      RVar2 = processPixel(this,(Segment *)local_14c,recursionLevel + 1);
      pSVar4 = __gnu_cxx::
               __normal_iterator<const_Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_>::
               operator->((__normal_iterator<const_Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_>
                           *)&this_local);
      local_178.b = local_69;
      local_178.r = (undefined1)local_6b;
      local_178.g = local_6b._1_1_;
      RVar2 = calculateColorFromReflection(local_178,RVar2,pSVar4->reflectionCoefficient);
      sphereIt_local._M_current._5_2_ = RVar2._0_2_;
      sphereIt_local._M_current._7_1_ = RVar2.b;
      goto LAB_00112d75;
    }
  }
  sphereIt_local._M_current._5_2_ = local_6b;
  sphereIt_local._M_current._7_1_ = local_69;
LAB_00112d75:
  local_180.b = sphereIt_local._M_current._7_1_;
  local_180.r = sphereIt_local._M_current._5_1_;
  local_180.g = sphereIt_local._M_current._6_1_;
  return local_180;
}

Assistant:

RGB RayTracer::processPixelOnSphere(Point const& rayBeg, Point const& pointOnSphere,
                                    std::vector<Sphere>::const_iterator sphereIt,
                                    int recursionLevel)
{
  bool const isInShadow =
      pointInShadow(pointOnSphere, config.light, config.spheres.cbegin(), sphereIt)
      || pointInShadow(pointOnSphere, config.light, sphereIt + 1, config.spheres.cend())
      || pointInShadow(pointOnSphere, config.light, config.planes.cbegin(), config.planes.cend());

  RGB resultCol;
  if (isInShadow)
    resultCol = sphereIt->color * config.ambientCoefficient;
  else
  {
    Vector const normalVec = (pointOnSphere - sphereIt->center) / sphereIt->radius;
    resultCol = calculateColorInLight(sphereIt->color, normalVec, config.light - pointOnSphere);
  }

  if (recursionLevel >= config.maxRecursionLevel || isCloseToZero(sphereIt->reflectionCoefficient))
    return resultCol;

  Segment refl = reflection({rayBeg, pointOnSphere}, *sphereIt);
  RGB reflectedColor = processPixel(refl, recursionLevel + 1);

  return calculateColorFromReflection(resultCol, reflectedColor, sphereIt->reflectionCoefficient);
}